

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

ModportPortSymbol *
slang::ast::ModportPortSymbol::fromSyntax
          (ASTContext *parentContext,ArgumentDirection direction,ModportExplicitPortSyntax *syntax)

{
  Compilation *this;
  bool bVar1;
  int iVar2;
  ModportPortSymbol *pMVar3;
  undefined4 extraout_var;
  Type *pTVar4;
  socklen_t __len;
  Token name;
  ASTContext context;
  ArgumentDirection local_94;
  SourceLocation local_90;
  Token local_88;
  string_view local_70;
  ASTContext local_60;
  Expression *this_00;
  
  local_94 = direction;
  ASTContext::resetFlags(&local_60,parentContext,(bitmask<slang::ast::ASTFlags>)0x100000020);
  this = (local_60.scope.ptr)->compilation;
  local_88.kind = (syntax->name).kind;
  local_88._2_1_ = (syntax->name).field_0x2;
  local_88.numFlags.raw = (syntax->name).numFlags.raw;
  local_88.rawLen = (syntax->name).rawLen;
  local_88.info = (syntax->name).info;
  local_70 = parsing::Token::valueText(&local_88);
  local_90 = parsing::Token::location(&local_88);
  pMVar3 = BumpAllocator::
           emplace<slang::ast::ModportPortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&>
                     (&this->super_BumpAllocator,&local_70,&local_90,&local_94);
  (pMVar3->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)syntax;
  if (syntax->expr == (ExpressionSyntax *)0x0) {
    pTVar4 = this->voidType;
  }
  else {
    __len = 0;
    if (local_94 - Out < 2) {
      __len = 0x100000;
    }
    iVar2 = Expression::bind((int)syntax->expr,(sockaddr *)&local_60,__len);
    this_00 = (Expression *)CONCAT44(extraout_var,iVar2);
    pMVar3->explicitConnection = this_00;
    pMVar3->connExpr = this_00;
    bVar1 = Expression::bad(this_00);
    if (!bVar1) {
      (pMVar3->super_ValueSymbol).declaredType.type = (this_00->type).ptr;
      Expression::checkConnectionDirection
                (this_00,local_94,&local_60,(pMVar3->super_ValueSymbol).super_Symbol.location,
                 (bitmask<slang::ast::AssignFlags>)0x0);
      return pMVar3;
    }
    pTVar4 = this->errorType;
  }
  (pMVar3->super_ValueSymbol).declaredType.type = pTVar4;
  return pMVar3;
}

Assistant:

ModportPortSymbol& ModportPortSymbol::fromSyntax(const ASTContext& parentContext,
                                                 ArgumentDirection direction,
                                                 const ModportExplicitPortSyntax& syntax) {
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural | ASTFlags::NotADriver);
    auto& comp = context.getCompilation();
    auto name = syntax.name;
    auto result = comp.emplace<ModportPortSymbol>(name.valueText(), name.location(), direction);
    result->setSyntax(syntax);

    if (!syntax.expr) {
        result->setType(comp.getVoidType());
        return *result;
    }

    bitmask<ASTFlags> extraFlags;
    if (direction == ArgumentDirection::Out || direction == ArgumentDirection::InOut) {
        extraFlags = ASTFlags::LValue;
        if (direction == ArgumentDirection::InOut)
            extraFlags |= ASTFlags::LAndRValue;
    }

    auto& expr = Expression::bind(*syntax.expr, context, extraFlags);
    result->explicitConnection = &expr;
    result->connExpr = &expr;
    if (expr.bad()) {
        result->setType(comp.getErrorType());
        return *result;
    }

    result->setType(*expr.type);

    Expression::checkConnectionDirection(expr, direction, context, result->location);

    return *result;
}